

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequenceDictionary.cpp
# Opt level: O0

void __thiscall
BamTools::SamSequenceDictionary::Add
          (SamSequenceDictionary *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *sequenceMap)

{
  bool bVar1;
  reference ppVar2;
  SamSequenceDictionary *in_RDI;
  int *in_stack_000000c0;
  string *in_stack_000000c8;
  SamSequence *in_stack_000000d0;
  int *length;
  string *name;
  const_iterator seqEnd;
  const_iterator seqIter;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_fffffffffffffec8;
  SamSequence *this_00;
  SamSequence *sequence;
  SamSequence local_108;
  int *local_30;
  reference local_28;
  _Self local_20;
  const_iterator local_18;
  
  local_18 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::begin(in_stack_fffffffffffffec8);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = std::operator!=(&stack0xffffffffffffffe8,&local_20);
    if (!bVar1) break;
    this_00 = (SamSequence *)&stack0xffffffffffffffe8;
    local_28 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                            *)this_00);
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                          *)this_00);
    local_30 = &ppVar2->second;
    sequence = &local_108;
    SamSequence::SamSequence(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
    Add(in_RDI,sequence);
    SamSequence::~SamSequence(this_00);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                  *)this_00);
  }
  return;
}

Assistant:

void SamSequenceDictionary::Add(const std::map<std::string, int>& sequenceMap)
{
    std::map<std::string, int>::const_iterator seqIter = sequenceMap.begin();
    std::map<std::string, int>::const_iterator seqEnd = sequenceMap.end();
    for (; seqIter != seqEnd; ++seqIter) {
        const std::string& name = (*seqIter).first;
        const int& length = (*seqIter).second;
        Add(SamSequence(name, length));
    }
}